

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSampleID>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceSampleID> *this,
               VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  uint y;
  TestStatus *pTVar1;
  uint uVar2;
  deUint32 sampleNdx;
  void *pvVar3;
  uint z;
  allocator<char> local_69;
  TestStatus *local_68;
  ConstPixelBufferAccess local_60;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *local_38;
  
  local_60.m_data = (void *)(ulong)imageMSInfo->samples;
  pvVar3 = (void *)0x0;
  local_68 = __return_storage_ptr__;
  local_38 = dataPerSample;
  do {
    if (pvVar3 == local_60.m_data) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Passed",&local_69);
      pTVar1 = local_68;
      tcu::TestStatus::pass(local_68,(string *)&local_60);
LAB_004f75b7:
      std::__cxx11::string::~string((string *)&local_60);
      return pTVar1;
    }
    for (uVar2 = 0; uVar2 < (imageMSInfo->extent).depth; uVar2 = uVar2 + 1) {
      for (z = 0; z < (imageMSInfo->extent).height; z = z + 1) {
        y = 0;
        while (y < (imageMSInfo->extent).width) {
          tcu::ConstPixelBufferAccess::getPixelUint
                    (&local_60,
                     (int)(local_38->
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          )._M_impl.super__Vector_impl_data._M_start + (int)pvVar3 * 0x28,y,z);
          y = y + 1;
          if (pvVar3 != (void *)(ulong)local_60.m_format.order) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_60,"gl_SampleID does not have correct value",&local_69);
            pTVar1 = local_68;
            tcu::TestStatus::fail(local_68,(string *)&local_60);
            goto LAB_004f75b7;
          }
        }
      }
    }
    pvVar3 = (void *)((long)pvVar3 + 1);
  } while( true );
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSampleID>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																			 const vk::VkImageCreateInfo&						imageRSInfo,
																			 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																			 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	DE_UNREF(imageRSInfo);
	DE_UNREF(dataRS);

	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
	{
		for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
		for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
		for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
		{
			const deUint32 sampleID = dataPerSample[sampleNdx].getPixelUint(x, y, z).x();

			if (sampleID != sampleNdx)
				return tcu::TestStatus::fail("gl_SampleID does not have correct value");
		}
	}

	return tcu::TestStatus::pass("Passed");
}